

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging_tests.c
# Opt level: O2

void failure_reported_and_exception_thrown_when_messaging_would_block(void)

{
  undefined4 uVar1;
  Constraint *pCVar2;
  int actual;
  uint actual_00;
  char panic_message [1000];
  
  uVar1 = start_cgreen_messaging(0x21);
  signal_received = 0;
  signal(0xd,catch_signal);
  panic_set_output_buffer(panic_message);
  actual_00 = 1;
  for (actual = 0; actual != 0x10001; actual = actual + 1) {
    send_cgreen_message(uVar1,99);
    if (signal_received != 0) goto LAB_00118144;
  }
  actual_00 = (uint)signal_received;
LAB_00118144:
  pCVar2 = (Constraint *)create_equal_to_value_constraint(1,"1");
  cgreen::assert_that_<int>
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/messaging_tests.c"
             ,0x3c,"signal_received",actual_00,pCVar2);
  pCVar2 = (Constraint *)create_less_than_value_constraint(0x10001,"LOOPS");
  cgreen::assert_that_<int>
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/messaging_tests.c"
             ,0x3d,"loop",actual,pCVar2);
  pCVar2 = (Constraint *)
           create_contains_string_constraint("Too many assertions","\"Too many assertions\"");
  cgreen::assert_that_<char*>
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/messaging_tests.c"
             ,0x3e,"panic_message",panic_message,pCVar2);
  return;
}

Assistant:

Ensure(failure_reported_and_exception_thrown_when_messaging_would_block) {
    const int LOOPS = 65537;
    int messaging = start_cgreen_messaging(33);
    int loop;
    char panic_message[1000];

    signal_received = 0;
    signal(SIGPIPE, catch_signal);

    panic_set_output_buffer(panic_message);

    for (loop = 0; loop < LOOPS; loop++) {
        send_cgreen_message(messaging, 99);
        if (signal_received == 1)
            break;
    }

    assert_that(signal_received, is_equal_to(1));
    assert_that(loop, is_less_than(LOOPS));
    assert_that(panic_message, contains_string("Too many assertions"));
}